

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_io_foreach_event_fn(event_base *base,int fd,evmap_io *io_info,void *arg)

{
  int iVar1;
  event *peStack_40;
  int r;
  event *ev;
  evmap_foreach_event_helper *h;
  void *arg_local;
  evmap_io *io_info_local;
  int fd_local;
  event_base *base_local;
  
  peStack_40 = (io_info->events).lh_first;
  while( true ) {
    if (peStack_40 == (event *)0x0) {
      return 0;
    }
    iVar1 = (**arg)(base,peStack_40,*(undefined8 *)((long)arg + 8));
    if (iVar1 != 0) break;
    peStack_40 = (peStack_40->ev_).ev_io.ev_io_next.le_next;
  }
  return iVar1;
}

Assistant:

static int
evmap_io_foreach_event_fn(struct event_base *base, evutil_socket_t fd,
    struct evmap_io *io_info, void *arg)
{
	struct evmap_foreach_event_helper *h = arg;
	struct event *ev;
	int r;
	LIST_FOREACH(ev, &io_info->events, ev_io_next) {
		if ((r = h->fn(base, ev, h->arg)))
			return r;
	}
	return 0;
}